

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<double>_>::SetBlockMatrix
          (TPZTransfer<std::complex<double>_> *this,int row,int col,
          TPZFMatrix<std::complex<double>_> *mat)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  void *pvVar5;
  int64_t iVar6;
  TPZBaseMatrix *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  TPZFMatrix<std::complex<double>_> bl;
  int nblcols;
  int nblrows;
  int lastic;
  int ic;
  int numcolblocks;
  int colpos;
  size_t in_stack_000002f8;
  char *in_stack_00000300;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar7;
  undefined8 in_stack_fffffffffffffee8;
  TPZTransfer<std::complex<double>_> *in_stack_fffffffffffffef0;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff30;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  complex<double> *in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff60;
  int local_24;
  
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x1c0),(long)in_ESI);
  local_24 = *piVar3;
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x1e0),(long)in_ESI);
  iVar1 = *piVar3;
  if ((local_24 == -1) || (iVar1 == -1)) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "TPZTransfer<TVar>::SetBlockMatrix called for ilegal parameters : ");
    poVar4 = std::operator<<(poVar4," row = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
    poVar4 = std::operator<<(poVar4," col = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
    poVar4 = std::operator<<(poVar4," colpos = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
    poVar4 = std::operator<<(poVar4," numcolblocks = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
  }
  iVar1 = local_24 + iVar1;
  for (; iVar7 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20), local_24 < iVar1;
      local_24 = local_24 + 1) {
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x248),(long)local_24);
    iVar7 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (*piVar3 == in_EDX) break;
  }
  if (local_24 == iVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "TPZTransfer<TVar>::SetBlockMatrix column not found for row = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
    poVar4 = std::operator<<(poVar4," col = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,in_EDX);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
  }
  iVar1 = TPZBlock::Size((TPZBlock *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
  iVar2 = TPZBlock::Size((TPZBlock *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
  iVar6 = TPZBaseMatrix::Rows(in_RCX);
  if ((iVar1 != iVar6) || (iVar6 = TPZBaseMatrix::Cols(in_RCX), iVar2 != iVar6)) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "TPZTransfer<TVar>::SetBlockMatrix matrix has incompatible dimensions :  nblrows = "
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," nblcols = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4," mat.rows = ");
    iVar6 = TPZBaseMatrix::Rows(in_RCX);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
    poVar4 = std::operator<<(poVar4," mat.cols ");
    iVar6 = TPZBaseMatrix::Cols(in_RCX);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar6);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
  }
  ExpandDoubleValueEntries(in_stack_fffffffffffffef0,iVar7);
  TPZVec<std::complex<double>_>::operator[]
            ((TPZVec<std::complex<double>_> *)(in_RDI + 0x298),(long)*(int *)(in_RDI + 0x358));
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TPZFMatrix<std::complex<double>_>::operator=(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  iVar7 = *(int *)(in_RDI + 0x358);
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x200),(long)local_24);
  *piVar3 = iVar7;
  *(int *)(in_RDI + 0x358) = iVar1 * iVar2 + *(int *)(in_RDI + 0x358);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x11cf35e);
  return;
}

Assistant:

void TPZTransfer<TVar>::SetBlockMatrix(int row, int col, TPZFMatrix<TVar> &mat){
	// sets the row,col block equal to matrix mat
	// if row col was not specified by AddBlockNumbers, an error
	//		will be issued and exit
	// find row,col
	int colpos = fColPosition[row];
	int numcolblocks = fNumberofColumnBlocks[row];
	if(colpos == -1 || numcolblocks == -1) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix called for ilegal parameters : "
		<< " row = " << row << " col = " << col << " colpos = " << colpos <<
		" numcolblocks = " << numcolblocks << endl;
		DebugStop();
	}
	int ic = colpos, lastic = colpos+numcolblocks;
	for(;ic<lastic;ic++) {
		if(fColumnBlockNumber[ic] == col) break;
	}
	if(ic == lastic) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix column not found for row = " << row <<
		" col = " << col << endl;
		DebugStop();
	}
	int nblrows = fRowBlock.Size(row);
	int nblcols = fColBlock.Size(col);
	if(nblrows != mat.Rows() || nblcols != mat.Cols()) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix matrix has incompatible dimensions : "
		" nblrows = " << nblrows << " nblcols = " << nblcols << " mat.rows = " <<
		mat.Rows() << " mat.cols " << mat.Cols() << endl;
		DebugStop();
	}
	ExpandDoubleValueEntries(nblrows*nblcols);
	TPZFMatrix<TVar> bl(nblrows,nblcols,&fDoubleValues[fDoubleValLastUsed],nblrows*nblcols);
	bl = mat;
	fColumnBlockPosition[ic] = fDoubleValLastUsed;
	fDoubleValLastUsed += nblrows*nblcols;
}